

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O2

void __thiscall
write_ini_item::operator()(write_ini_item *this,sector_item *item,xr_ini_writer *w,uint32_t id)

{
  int iVar1;
  char buf [128];
  string asStack_e8 [32];
  string local_c8 [32];
  char local_a8 [136];
  
  iVar1 = snprintf(local_a8,0x80,"item_mesh_name_%04d");
  if (0 < iVar1) {
    std::__cxx11::string::string(local_c8,(string *)&item->mesh);
    xray_re::xr_ini_writer::write(w,(int)local_a8,local_c8,0);
    std::__cxx11::string::~string(local_c8);
  }
  iVar1 = snprintf(local_a8,0x80,"item_object_name_%04d");
  if (0 < iVar1) {
    std::__cxx11::string::string(asStack_e8,(string *)item);
    xray_re::xr_ini_writer::write(w,(int)local_a8,asStack_e8,0);
    std::__cxx11::string::~string(asStack_e8);
  }
  return;
}

Assistant:

void operator()(const sector_item& item, xr_ini_writer* w, uint32_t id) const {
	char buf[128];
	int n = xr_snprintf(buf, sizeof(buf), "item_mesh_name_%04d", id);
	if (n > 0)
		w->write(buf, item.mesh, false);

	n = xr_snprintf(buf, sizeof(buf), "item_object_name_%04d", id);
	if (n > 0)
		w->write(buf, item.object, false);
}